

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-msg.c
# Opt level: O1

_Bool redundant_monster_message(monster_conflict *mon,wchar_t msg_code)

{
  ulong uVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  if (mon == (monster_conflict *)0x0) {
    __assert_fail("mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-msg.c"
                  ,0x96,"_Bool redundant_monster_message(struct monster *, int)");
  }
  uVar1 = (ulong)size_mon_hist;
  bVar4 = 0 < (long)uVar1;
  if (0 < (long)uVar1) {
    pwVar2 = &mon_message_hist[0].message_code;
    uVar3 = 1;
    do {
      if ((((monster_message_history *)(pwVar2 + -2))->mon == mon) && (*pwVar2 == msg_code)) {
        return bVar4;
      }
      bVar4 = uVar3 < uVar1;
      pwVar2 = pwVar2 + 4;
      bVar5 = uVar3 != uVar1;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  return bVar4;
}

Assistant:

static bool redundant_monster_message(struct monster *mon, int msg_code)
{
	assert(mon);
	assert(msg_code >= 0);
	assert(msg_code < MON_MSG_MAX);

	for (int i = 0; i < size_mon_hist; i++) {
		/* Check for a matched monster & monster code */
		if (mon == mon_message_hist[i].mon &&
				msg_code == mon_message_hist[i].message_code) {
			return true;
		}
	}

	return false;
}